

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O0

bool __thiscall flexbuffers::Verifier::VerifyKeys(Verifier *this,uint8_t *p,uint8_t byte_width)

{
  bool bVar1;
  uint64_t uVar2;
  Reference local_50;
  uint8_t local_39;
  uint64_t uStack_38;
  uint8_t key_byte_with;
  uint64_t off;
  size_t num_prefixed_fields;
  uint8_t *puStack_20;
  uint8_t byte_width_local;
  uint8_t *p_local;
  Verifier *this_local;
  
  off = 3;
  num_prefixed_fields._7_1_ = byte_width;
  puStack_20 = p;
  p_local = (uint8_t *)this;
  bVar1 = VerifyBeforePointer(this,p,(ulong)byte_width * 3);
  if (bVar1) {
    puStack_20 = puStack_20 + (ulong)num_prefixed_fields._7_1_ * -3;
    uStack_38 = ReadUInt64(puStack_20,num_prefixed_fields._7_1_);
    bVar1 = VerifyOffset(this,uStack_38,puStack_20);
    if (bVar1) {
      uVar2 = ReadUInt64(puStack_20 + (int)(uint)num_prefixed_fields._7_1_,num_prefixed_fields._7_1_
                        );
      local_39 = (uint8_t)uVar2;
      bVar1 = VerifyByteWidth(this,uVar2 & 0xff);
      if (bVar1) {
        Reference::Reference(&local_50,puStack_20,num_prefixed_fields._7_1_,local_39,FBT_VECTOR_KEY)
        ;
        this_local._7_1_ = VerifyVector(this,local_50,puStack_20 + -uStack_38,FBT_KEY);
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool VerifyKeys(const uint8_t *p, uint8_t byte_width) {
    // The vector part of the map has already been verified.
    const size_t num_prefixed_fields = 3;
    if (!VerifyBeforePointer(p, byte_width * num_prefixed_fields)) return false;
    p -= byte_width * num_prefixed_fields;
    auto off = ReadUInt64(p, byte_width);
    if (!VerifyOffset(off, p)) return false;
    auto key_byte_with =
        static_cast<uint8_t>(ReadUInt64(p + byte_width, byte_width));
    if (!VerifyByteWidth(key_byte_with)) return false;
    return VerifyVector(Reference(p, byte_width, key_byte_with, FBT_VECTOR_KEY),
                        p - off, FBT_KEY);
  }